

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O2

optional<siginfo_t> * __thiscall
pstack::Procman::CoreProcess::getSignalInfo
          (optional<siginfo_t> *__return_storage_ptr__,CoreProcess *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Elf64_Word EVar1;
  optional<siginfo_t> *poVar2;
  bool bVar3;
  long lVar4;
  anon_struct_128_5_975a5653_for__M_value *paVar5;
  optional<siginfo_t> *poVar6;
  byte bVar7;
  anon_struct_128_5_975a5653_for__M_value local_170;
  iterator local_f0 [8];
  iterator __begin2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  iterator local_b0 [8];
  iterator __end2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  element_type *local_70;
  NoteDesc local_68;
  Reader *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  optional<siginfo_t> *local_38;
  
  bVar7 = 0;
  local_70 = (this->coreImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_38 = __return_storage_ptr__;
  pstack::Elf::Notes::begin();
  pstack::Elf::Notes::end();
  this_00 = &local_68.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  do {
    bVar3 = Elf::Notes::iterator::operator!=(local_f0,local_b0);
    if (!bVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
      (local_38->super__Optional_base<siginfo_t,_true,_true>)._M_payload.
      super__Optional_payload_base<siginfo_t>._M_engaged = false;
      return local_38;
    }
    Elf::Notes::iterator::operator*(&local_68,local_f0);
    pstack::Elf::NoteDesc::name_abi_cxx11_();
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_170,"CORE");
    EVar1 = local_68.note.n_type;
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_170);
      if (EVar1 == 0x53494749) {
        pstack::Elf::NoteDesc::data();
        Reader::readObj<siginfo_t>(&local_170,local_48,0);
        poVar2 = local_38;
        paVar5 = &local_170;
        poVar6 = local_38;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined8 *)
           &(poVar6->super__Optional_base<siginfo_t,_true,_true>)._M_payload.
            super__Optional_payload_base<siginfo_t>._M_payload = *(undefined8 *)paVar5;
          paVar5 = (anon_struct_128_5_975a5653_for__M_value *)
                   ((long)paVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          poVar6 = (optional<siginfo_t> *)((long)poVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        (local_38->super__Optional_base<siginfo_t,_true,_true>)._M_payload.
        super__Optional_payload_base<siginfo_t>._M_engaged = true;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
        return poVar2;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_170);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    pstack::Elf::Notes::iterator::operator++(local_f0);
  } while( true );
}

Assistant:

std::optional<siginfo_t>
CoreProcess::getSignalInfo() const {
   for ( const auto &note : coreImage->notes() ) {
      if ( note.name() == "CORE" && note.type() == NT_SIGINFO ) {
         return note.data()->readObj<siginfo_t>(0);
      }
   }
   return std::nullopt;
}